

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O1

void __thiscall BackgroundParser::JobProcessed(BackgroundParser *this,Job *job,bool succeeded)

{
  uint uVar1;
  uint uVar2;
  Type pJVar3;
  CompileScriptException *pCVar4;
  code *pcVar5;
  undefined3 uVar6;
  FailureReason FVar7;
  bool bVar8;
  undefined4 *puVar9;
  
  if (this->unprocessedItemsHead == (BackgroundParseItem *)job) {
    this->unprocessedItemsHead = *(BackgroundParseItem **)&job[3].isCritical;
  }
  else {
    uVar6 = *(undefined3 *)&job[3].field_0x19;
    FVar7 = job[3].failureReason;
    pJVar3 = job[4].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous;
    pJVar3[3].isCritical = job[3].isCritical;
    *(undefined3 *)&pJVar3[3].field_0x19 = uVar6;
    pJVar3[3].failureReason = FVar7;
  }
  if (this->unprocessedItemsTail == (BackgroundParseItem *)job) {
    this->unprocessedItemsTail =
         (BackgroundParseItem *)
         job[4].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous;
  }
  else {
    *(Type *)(*(long *)&job[3].isCritical + 0x80) =
         job[4].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous;
  }
  job[3].isCritical = false;
  *(undefined3 *)&job[3].field_0x19 = 0;
  job[3].failureReason = NotFailed;
  job[4].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous = (Type)0x0;
  this->pendingBackgroundItems = this->pendingBackgroundItems - 1;
  if (!succeeded) {
    if ((-1 < *(int *)&job[5].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
                       previous) && (this->failedBackgroundParseItem == (BackgroundParseItem *)0x0))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
                         ,0x76,
                         "(((HRESULT)(backgroundItem->GetHR())<0) || failedBackgroundParseItem)",
                         "FAILED(backgroundItem->GetHR()) || failedBackgroundParseItem");
      if (!bVar8) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar9 = 0;
    }
    if (*(int *)&job[5].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous
        < 0) {
      if (this->failedBackgroundParseItem != (BackgroundParseItem *)0x0) {
        pCVar4 = this->failedBackgroundParseItem->pse;
        uVar1 = pCVar4->line;
        uVar2 = job[4].manager[1].numJobsAddedToProcessor;
        if ((int)uVar1 <= (int)uVar2) {
          if (uVar2 != uVar1) {
            return;
          }
          if (pCVar4->ichMinLine <= *(int *)&job[4].manager[1].isWaitable) {
            return;
          }
        }
      }
      this->failedBackgroundParseItem = (BackgroundParseItem *)job;
    }
  }
  return;
}

Assistant:

void BackgroundParser::JobProcessed(JsUtil::Job *const job, const bool succeeded)
{
    // This is called from inside a lock, so we can mess with background parser attributes.
    BackgroundParseItem *backgroundItem = static_cast<BackgroundParseItem*>(job);
    this->RemoveFromUnprocessedItems(backgroundItem);
    --this->pendingBackgroundItems;
    if (!succeeded)
    {
        Assert(FAILED(backgroundItem->GetHR()) || failedBackgroundParseItem);

        if (FAILED(backgroundItem->GetHR()))
        {
            if (!failedBackgroundParseItem)
            {
                failedBackgroundParseItem = backgroundItem;
            }
            else
            {
                // If syntax errors are detected on multiple threads, the lexically earlier one should win.
                CompileScriptException *newPse = backgroundItem->GetPSE();
                CompileScriptException *oldPse = failedBackgroundParseItem->GetPSE();

                if (newPse->line < oldPse->line ||
                    (newPse->line == oldPse->line && newPse->ichMinLine < oldPse->ichMinLine))
                {
                    failedBackgroundParseItem = backgroundItem;
                }
            }
        }
    }
}